

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

void co_yield_ct(void)

{
  int iVar1;
  long lVar2;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  long *plVar3;
  
  plVar3 = (long *)__tls_get_addr(&PTR_00109fa8);
  lVar2 = *plVar3;
  iVar1 = *(int *)(lVar2 + 0x400);
  pending_co = *(stCoRoutine_t **)(lVar2 + -0x10 + (long)iVar1 * 8);
  curr = *(stCoRoutine_t **)(lVar2 + -8 + (long)iVar1 * 8);
  *(int *)(lVar2 + 0x400) = iVar1 + -1;
  co_swap(curr,pending_co);
  return;
}

Assistant:

void co_yield_ct()
{

	co_yield_env( co_get_curr_thread_env() );
}